

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall Search::predictor::set_input(predictor *this,example *input_example)

{
  example *in_RSI;
  predictor *in_RDI;
  
  free_ec((predictor *)in_RSI);
  in_RDI->is_ldf = false;
  in_RDI->ec = in_RSI;
  in_RDI->ec_cnt = 1;
  in_RDI->ec_alloced = false;
  return in_RDI;
}

Assistant:

predictor& predictor::set_input(example& input_example)
{
  free_ec();
  is_ldf = false;
  ec = &input_example;
  ec_cnt = 1;
  ec_alloced = false;
  return *this;
}